

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_set_hflag(DisasContext *s,uint32_t mask)

{
  TCGContext *s_00;
  TCGTemp *ts;
  
  if (((uint)s->flags & mask) != 0) {
    return;
  }
  s_00 = s->uc->tcg_ctx;
  ts = tcg_temp_new_internal_x86_64(s_00,TCG_TYPE_I32,false);
  tcg_gen_op3_x86_64(s_00,INDEX_op_ld_i32,(TCGArg)ts,(TCGArg)(s_00->cpu_env + (long)s_00),0xb0);
  tcg_gen_ori_i32_x86_64
            (s_00,(TCGv_i32)((long)ts - (long)s_00),(TCGv_i32)((long)ts - (long)s_00),mask);
  tcg_gen_op3_x86_64(s_00,INDEX_op_st_i32,(TCGArg)ts,(TCGArg)(s_00->cpu_env + (long)s_00),0xb0);
  tcg_temp_free_internal_x86_64(s_00,ts);
  s->flags = s->flags | (ulong)mask;
  return;
}

Assistant:

static void gen_set_hflag(DisasContext *s, uint32_t mask)
{
    if ((s->flags & mask) == 0) {
        TCGContext *tcg_ctx = s->uc->tcg_ctx;

        TCGv_i32 t = tcg_temp_new_i32(tcg_ctx);
        tcg_gen_ld_i32(tcg_ctx, t, tcg_ctx->cpu_env, offsetof(CPUX86State, hflags));
        tcg_gen_ori_i32(tcg_ctx, t, t, mask);
        tcg_gen_st_i32(tcg_ctx, t, tcg_ctx->cpu_env, offsetof(CPUX86State, hflags));
        tcg_temp_free_i32(tcg_ctx, t);
        s->flags |= mask;
    }
}